

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_NUM64(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,unsigned_long_long num)

{
  x86Argument arg;
  x86Argument local_40;
  unsigned_long_long local_20;
  unsigned_long_long num_local;
  x86Reg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  local_20 = num;
  num_local._0_4_ = reg1;
  num_local._4_4_ = op;
  _reg1_local = ctx;
  if (op != o_mov64) {
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x4a3,
                  "void EMIT_OP_REG_NUM64(CodeGenGenericContext &, x86Command, x86Reg, unsigned long long)"
                 );
  }
  if ((ctx->skipTracking & 1U) == 0) {
    if ((ctx->genReg[reg1].type == argImm64) && (ctx->genReg[reg1].field_1.imm64Arg == num)) {
      ctx->optimizationCount = ctx->optimizationCount + 1;
      return;
    }
    x86Argument::x86Argument(&local_40,num);
    arg.field_1.imm64Arg = local_40.field_1.imm64Arg;
    arg.type = local_40.type;
    arg._4_4_ = local_40._4_4_;
    arg.ptrBase = local_40.ptrBase;
    arg.ptrIndex = local_40.ptrIndex;
    arg.ptrMult = local_40.ptrMult;
    arg.ptrNum = local_40.ptrNum;
    CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
  }
  _reg1_local->x86Op->name = num_local._4_4_;
  (_reg1_local->x86Op->argA).type = argReg;
  (_reg1_local->x86Op->argA).field_1.reg = (x86Reg)num_local;
  (_reg1_local->x86Op->argB).type = argImm64;
  (_reg1_local->x86Op->argB).field_1.imm64Arg = local_20;
  _reg1_local->x86Op = _reg1_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_NUM64(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, unsigned long long num)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_mov64:
		if(ctx.skipTracking)
			break;

		// Skip move if the target already contains the same number
		if(ctx.genReg[reg1].type == x86Argument::argImm64 && ctx.genReg[reg1].imm64Arg == num)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(num));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argImm64;
	ctx.x86Op->argB.imm64Arg = num;
	ctx.x86Op++;
}